

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::operator=(Value *this,Value *other)

{
  ValueHolder VVar1;
  ushort uVar2;
  ValueHolder local_20;
  ushort local_18;
  
  Value((Value *)&local_20,other);
  VVar1 = this->value_;
  this->value_ = local_20;
  uVar2 = *(ushort *)&this->field_0x8;
  *(ushort *)&this->field_0x8 = local_18 & 0x1ff | uVar2 & 0xfe00;
  local_18 = uVar2 & 0x1ff | local_18 & 0xfe00;
  local_20 = VVar1;
  ~Value((Value *)&local_20);
  return this;
}

Assistant:

Value&
Value::operator= ( const Value& other )
{
    Value temp ( other );
    swap ( temp );
    return *this;
}